

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

void Saig_ManWindowOutline_rec(Aig_Man_t *p,Aig_Obj_t *pObj,int nDist,Vec_Ptr_t *vNodes,int *pDists)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  int local_78;
  int local_60;
  int local_4c;
  int local_48;
  int i;
  int iFanout;
  int fCollected;
  Aig_Obj_t *pFanout;
  Aig_Obj_t *pMatch;
  int *pDists_local;
  Vec_Ptr_t *vNodes_local;
  int nDist_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  local_48 = -1;
  if ((nDist != 0) && (pDists[pObj->Id] < nDist)) {
    pDists[pObj->Id] = nDist;
    iVar2 = Aig_ObjIsTravIdCurrent(p,pObj);
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar3 = Aig_ObjIsConst1(pObj);
    if ((iVar3 == 0) && (iVar3 = Saig_ObjIsPo(p,pObj), iVar3 == 0)) {
      iVar3 = Saig_ObjIsLi(p,pObj);
      if (iVar3 == 0) {
        if (iVar2 == 0) {
          Vec_PtrPush(vNodes,pObj);
        }
        iVar2 = Saig_ObjIsPi(p,pObj);
        if (iVar2 == 0) {
          iVar2 = Saig_ObjIsLo(p,pObj);
          if (iVar2 == 0) {
            iVar2 = Aig_ObjIsNode(pObj);
            if (iVar2 == 0) {
              __assert_fail("Aig_ObjIsNode(pObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                            ,0x52,
                            "void Saig_ManWindowOutline_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *)"
                           );
            }
            pAVar4 = Aig_ObjFanin0(pObj);
            Saig_ManWindowOutline_rec(p,pAVar4,nDist + -1,vNodes,pDists);
            pAVar4 = Aig_ObjFanin1(pObj);
            Saig_ManWindowOutline_rec(p,pAVar4,nDist + -1,vNodes,pDists);
            if (p->pFanData == (int *)0x0) {
              __assert_fail("p->pFanData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                            ,0x55,
                            "void Saig_ManWindowOutline_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *)"
                           );
            }
            local_4c = 0;
            while( true ) {
              bVar1 = false;
              if (local_4c < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
                if (local_4c == 0) {
                  local_78 = Aig_ObjFanout0Int(p,pObj->Id);
                }
                else {
                  local_78 = Aig_ObjFanoutNext(p,local_48);
                }
                local_48 = local_78;
                _iFanout = Aig_ManObj(p,local_78 >> 1);
                bVar1 = true;
              }
              if (!bVar1) break;
              Saig_ManWindowOutline_rec(p,_iFanout,nDist + -1,vNodes,pDists);
              local_4c = local_4c + 1;
            }
          }
          else {
            pAVar4 = Saig_ObjLoToLi(p,pObj);
            iVar2 = Aig_ObjIsTravIdCurrent(p,pAVar4);
            if (iVar2 == 0) {
              Saig_ManWindowOutline_rec(p,pAVar4,nDist,vNodes,pDists);
            }
            if (p->pFanData == (int *)0x0) {
              __assert_fail("p->pFanData",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/saig/saigWnd.c"
                            ,0x4e,
                            "void Saig_ManWindowOutline_rec(Aig_Man_t *, Aig_Obj_t *, int, Vec_Ptr_t *, int *)"
                           );
            }
            local_4c = 0;
            while( true ) {
              bVar1 = false;
              if (local_4c < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
                if (local_4c == 0) {
                  local_60 = Aig_ObjFanout0Int(p,pObj->Id);
                }
                else {
                  local_60 = Aig_ObjFanoutNext(p,local_48);
                }
                local_48 = local_60;
                _iFanout = Aig_ManObj(p,local_60 >> 1);
                bVar1 = true;
              }
              if (!bVar1) break;
              Saig_ManWindowOutline_rec(p,_iFanout,nDist + -1,vNodes,pDists);
              local_4c = local_4c + 1;
            }
          }
        }
      }
      else {
        pAVar4 = Saig_ObjLiToLo(p,pObj);
        iVar2 = Aig_ObjIsTravIdCurrent(p,pAVar4);
        if (iVar2 == 0) {
          Saig_ManWindowOutline_rec(p,pAVar4,nDist,vNodes,pDists);
        }
        pAVar4 = Aig_ObjFanin0(pObj);
        Saig_ManWindowOutline_rec(p,pAVar4,nDist + -1,vNodes,pDists);
      }
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Returns the array of PI/internal nodes.]

  Description [Marks all the visited nodes with the current ID.
  Does not collect constant node and PO/LI nodes.]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Saig_ManWindowOutline_rec( Aig_Man_t * p, Aig_Obj_t * pObj, int nDist, Vec_Ptr_t * vNodes, int * pDists )
{
    Aig_Obj_t * pMatch, * pFanout;
    int fCollected, iFanout = -1, i;
    if ( nDist == 0 )
        return;
    if ( pDists[pObj->Id] >= nDist )
        return;
    pDists[pObj->Id] = nDist;
    fCollected = Aig_ObjIsTravIdCurrent( p, pObj );
    Aig_ObjSetTravIdCurrent( p, pObj );    
    if ( Aig_ObjIsConst1(pObj) )
        return;
    if ( Saig_ObjIsPo(p, pObj) )
        return;
    if ( Saig_ObjIsLi(p, pObj) )
    {
        pMatch = Saig_ObjLiToLo( p, pObj );
        if ( !Aig_ObjIsTravIdCurrent( p, pMatch ) )
            Saig_ManWindowOutline_rec( p, pMatch, nDist, vNodes, pDists );
        Saig_ManWindowOutline_rec( p, Aig_ObjFanin0(pObj), nDist-1, vNodes, pDists );
        return;
    }
    if ( !fCollected )
        Vec_PtrPush( vNodes, pObj );
    if ( Saig_ObjIsPi(p, pObj) )
        return;
    if ( Saig_ObjIsLo(p, pObj) )
    {
        pMatch = Saig_ObjLoToLi( p, pObj );
        if ( !Aig_ObjIsTravIdCurrent( p, pMatch ) )
            Saig_ManWindowOutline_rec( p, pMatch, nDist, vNodes, pDists );
        Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
            Saig_ManWindowOutline_rec( p, pFanout, nDist-1, vNodes, pDists );
        return;
    }
    assert( Aig_ObjIsNode(pObj) );
    Saig_ManWindowOutline_rec( p, Aig_ObjFanin0(pObj), nDist-1, vNodes, pDists );
    Saig_ManWindowOutline_rec( p, Aig_ObjFanin1(pObj), nDist-1, vNodes, pDists );
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        Saig_ManWindowOutline_rec( p, pFanout, nDist-1, vNodes, pDists );
}